

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

NetAliasSymbol *
slang::ast::NetAliasSymbol::fromSyntax
          (ASTContext *parentContext,NetAliasSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  pointer ppIVar1;
  char *pcVar2;
  Compilation *compilation;
  size_t sVar3;
  IdentifierNameSyntax *syntax_00;
  int iVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  NetType *netType;
  SyntaxNode *expr;
  uint64_t hash;
  NetAliasSymbol *this;
  ulong uVar12;
  pointer ppIVar13;
  ASTContext *context_00;
  long lVar14;
  ulong uVar15;
  ulong pos0;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 local_208 [16];
  const_iterator __begin2;
  undefined1 local_1b0 [24];
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  ASTContext context;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&seenNames);
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  compilation = (context.scope.ptr)->compilation;
  netType = Scope::getDefaultNetType(context.scope.ptr);
  __begin2.index = 0;
  sVar3 = (syntax->nets).elements._M_extent._M_extent_value;
  __begin2.list = &syntax->nets;
  do {
    if ((__begin2.list == &syntax->nets) && (__begin2.index == sVar3 + 1 >> 1)) {
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
           (pointer)parsing::Token::location(&syntax->keyword);
      this = BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
                       (&compilation->super_BumpAllocator,(SourceLocation *)&implicitNetNames);
      (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
      syntax_01._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_01._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&this->super_Symbol,context.scope.ptr,syntax_01);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     *)&seenNames.super_Storage.field_0x88);
      return this;
    }
    expr = &slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
            iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference(&__begin2)->
            super_SyntaxNode;
    if (netType->netKind != Unknown) {
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
           (pointer)implicitNetNames.
                    super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.firstElement;
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len = 0;
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.cap = 5;
      context_00 = &context;
      Expression::findPotentiallyImplicitNets
                (expr,context_00,
                 &implicitNetNames.
                  super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
      ppIVar1 = implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.
                data_ + implicitNetNames.
                        super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len;
      for (ppIVar13 = implicitNetNames.
                      super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_;
          ppIVar13 != ppIVar1; ppIVar13 = ppIVar13 + 1) {
        syntax_00 = *ppIVar13;
        local_208 = (undefined1  [16])parsing::Token::valueText(&syntax_00->identifier);
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &seenNames.super_Storage.field_0x88,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_208);
        pos0 = hash >> (seenNames._144_1_ & 0x3f);
        lVar14 = (hash & 0xff) * 4;
        cVar5 = (&UNK_007e24cc)[lVar14];
        cVar6 = (&UNK_007e24cd)[lVar14];
        cVar7 = (&UNK_007e24ce)[lVar14];
        bVar8 = (&UNK_007e24cf)[lVar14];
        uVar12 = 0;
        uVar15 = pos0;
        do {
          pcVar2 = (char *)(seenNames._160_8_ + uVar15 * 0x10);
          bVar10 = pcVar2[0xf];
          auVar17[0] = -(*pcVar2 == cVar5);
          auVar17[1] = -(pcVar2[1] == cVar6);
          auVar17[2] = -(pcVar2[2] == cVar7);
          auVar17[3] = -(pcVar2[3] == bVar8);
          auVar17[4] = -(pcVar2[4] == cVar5);
          auVar17[5] = -(pcVar2[5] == cVar6);
          auVar17[6] = -(pcVar2[6] == cVar7);
          auVar17[7] = -(pcVar2[7] == bVar8);
          auVar17[8] = -(pcVar2[8] == cVar5);
          auVar17[9] = -(pcVar2[9] == cVar6);
          auVar17[10] = -(pcVar2[10] == cVar7);
          auVar17[0xb] = -(pcVar2[0xb] == bVar8);
          auVar17[0xc] = -(pcVar2[0xc] == cVar5);
          auVar17[0xd] = -(pcVar2[0xd] == cVar6);
          auVar17[0xe] = -(pcVar2[0xe] == cVar7);
          auVar17[0xf] = -(bVar10 == bVar8);
          uVar11 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
          if (uVar11 != 0) {
            lVar16 = seenNames._160_8_ + uVar15 * 0x10;
            lVar14 = seenNames._168_8_ + uVar15 * 0xf0;
            do {
              iVar4 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              context_00 = (ASTContext *)local_208;
              bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )&seenNames.super_Storage.field_0x88,
                                 (basic_string_view<char,_std::char_traits<char>_> *)context_00,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 ((ulong)(uint)(iVar4 << 4) + lVar14));
              if (bVar9) goto LAB_00670e9a;
              uVar11 = uVar11 - 1 & uVar11;
            } while (uVar11 != 0);
            bVar10 = *(byte *)(lVar16 + 0xf);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar10) == 0) break;
          lVar14 = uVar15 + uVar12;
          uVar12 = uVar12 + 1;
          uVar15 = lVar14 + 1U & seenNames._152_8_;
        } while (uVar12 <= (ulong)seenNames._152_8_);
        if ((ulong)seenNames._184_8_ < (ulong)seenNames._176_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_1b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                      *)&seenNames.super_Storage.field_0x88,pos0,hash,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_208);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_1b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                      *)&seenNames.super_Storage.field_0x88,hash,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_208);
        }
        local_1b0._0_8_ = NetSymbol::createImplicit(compilation,syntax_00,netType);
        context_00 = (ASTContext *)local_1b0;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitNets,(Symbol **)context_00)
        ;
LAB_00670e9a:
      }
      SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::cleanup
                (&implicitNetNames.
                  super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>,
                 (EVP_PKEY_CTX *)context_00);
    }
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

NetAliasSymbol& NetAliasSymbol::fromSyntax(const ASTContext& parentContext,
                                           const syntax::NetAliasSyntax& syntax,
                                           SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> seenNames;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& comp = context.getCompilation();
    auto& netType = context.scope->getDefaultNetType();

    for (auto expr : syntax.nets) {
        // If not explicitly disabled check for implicit nets.
        if (!netType.isError()) {
            SmallVector<const IdentifierNameSyntax*> implicitNetNames;
            Expression::findPotentiallyImplicitNets(*expr, context, implicitNetNames);

            for (auto ins : implicitNetNames) {
                if (seenNames.emplace(ins->identifier.valueText()).second)
                    implicitNets.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
            }
        }
    }

    auto result = comp.emplace<NetAliasSymbol>(syntax.keyword.location());
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);
    return *result;
}